

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::BilinearIntersection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BilinearIntersection *this)

{
  float *in_R8;
  
  StringPrintf<pbrt::Point2<float>const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ BilinearIntersection uv: %s t: %f",(char *)this,
             (Point2<float> *)&this->t,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string BilinearIntersection::ToString() const {
    return StringPrintf("[ BilinearIntersection uv: %s t: %f", uv, t);
}